

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slapack_lite.c
# Opt level: O0

int sposv_(char *uplo,integer *n,integer *nrhs,real *a,integer *lda,real *b,integer *ldb,
          integer *info)

{
  logical lVar1;
  int local_64;
  int local_5c;
  int local_54;
  int local_50;
  integer i__1;
  integer b_offset;
  integer b_dim1;
  integer a_offset;
  integer a_dim1;
  real *b_local;
  integer *lda_local;
  real *a_local;
  integer *nrhs_local;
  integer *n_local;
  char *uplo_local;
  
  b_dim1 = *lda;
  b_offset = b_dim1 + 1;
  lda_local = (integer *)(a + -(long)b_offset);
  i__1 = *ldb;
  local_50 = i__1 + 1;
  _a_offset = b + -(long)local_50;
  *info = 0;
  b_local = (real *)lda;
  a_local = (real *)nrhs;
  nrhs_local = n;
  n_local = (integer *)uplo;
  lVar1 = lsame_(uplo,"U");
  if ((lVar1 == 0) && (lVar1 = lsame_((char *)n_local,"L"), lVar1 == 0)) {
    *info = -1;
  }
  else if (*nrhs_local < 0) {
    *info = -2;
  }
  else if ((int)*a_local < 0) {
    *info = -3;
  }
  else {
    if (*nrhs_local < 2) {
      local_5c = 1;
    }
    else {
      local_5c = *nrhs_local;
    }
    if ((int)*b_local < local_5c) {
      *info = -5;
    }
    else {
      if (*nrhs_local < 2) {
        local_64 = 1;
      }
      else {
        local_64 = *nrhs_local;
      }
      if (*ldb < local_64) {
        *info = -7;
      }
    }
  }
  if (*info == 0) {
    spotrf_((char *)n_local,nrhs_local,(real *)(lda_local + b_offset),(integer *)b_local,info);
    if (*info == 0) {
      spotrs_((char *)n_local,nrhs_local,(integer *)a_local,(real *)(lda_local + b_offset),
              (integer *)b_local,_a_offset + local_50,ldb,info);
    }
  }
  else {
    local_54 = -*info;
    xerbla_("SPOSV ",&local_54);
  }
  return 0;
}

Assistant:

int sposv_(char *uplo, integer *n, integer *nrhs, real *a,
	integer *lda, real *b, integer *ldb, integer *info)
{
    /* System generated locals */
    integer a_dim1, a_offset, b_dim1, b_offset, i__1;

    /* Local variables */
    extern logical lsame_(char *, char *);
    extern /* Subroutine */ int xerbla_(char *, integer *), spotrf_(
	    char *, integer *, real *, integer *, integer *), spotrs_(
	    char *, integer *, integer *, real *, integer *, real *, integer *
	    , integer *);


/*
    -- LAPACK driver routine (version 3.0) --
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,
       Courant Institute, Argonne National Lab, and Rice University
       March 31, 1993


    Purpose
    =======

    SPOSV computes the solution to a real system of linear equations
       A * X = B,
    where A is an N-by-N symmetric positive definite matrix and X and B
    are N-by-NRHS matrices.

    The Cholesky decomposition is used to factor A as
       A = U**T* U,  if UPLO = 'U', or
       A = L * L**T,  if UPLO = 'L',
    where U is an upper triangular matrix and L is a lower triangular
    matrix.  The factored form of A is then used to solve the system of
    equations A * X = B.

    Arguments
    =========

    UPLO    (input) CHARACTER*1
            = 'U':  Upper triangle of A is stored;
            = 'L':  Lower triangle of A is stored.

    N       (input) INTEGER
            The number of linear equations, i.e., the order of the
            matrix A.  N >= 0.

    NRHS    (input) INTEGER
            The number of right hand sides, i.e., the number of columns
            of the matrix B.  NRHS >= 0.

    A       (input/output) REAL array, dimension (LDA,N)
            On entry, the symmetric matrix A.  If UPLO = 'U', the leading
            N-by-N upper triangular part of A contains the upper
            triangular part of the matrix A, and the strictly lower
            triangular part of A is not referenced.  If UPLO = 'L', the
            leading N-by-N lower triangular part of A contains the lower
            triangular part of the matrix A, and the strictly upper
            triangular part of A is not referenced.

            On exit, if INFO = 0, the factor U or L from the Cholesky
            factorization A = U**T*U or A = L*L**T.

    LDA     (input) INTEGER
            The leading dimension of the array A.  LDA >= max(1,N).

    B       (input/output) REAL array, dimension (LDB,NRHS)
            On entry, the N-by-NRHS right hand side matrix B.
            On exit, if INFO = 0, the N-by-NRHS solution matrix X.

    LDB     (input) INTEGER
            The leading dimension of the array B.  LDB >= max(1,N).

    INFO    (output) INTEGER
            = 0:  successful exit
            < 0:  if INFO = -i, the i-th argument had an illegal value
            > 0:  if INFO = i, the leading minor of order i of A is not
                  positive definite, so the factorization could not be
                  completed, and the solution has not been computed.

    =====================================================================


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    b_dim1 = *ldb;
    b_offset = 1 + b_dim1;
    b -= b_offset;

    /* Function Body */
    *info = 0;
    if (! lsame_(uplo, "U") && ! lsame_(uplo, "L")) {
	*info = -1;
    } else if (*n < 0) {
	*info = -2;
    } else if (*nrhs < 0) {
	*info = -3;
    } else if (*lda < max(1,*n)) {
	*info = -5;
    } else if (*ldb < max(1,*n)) {
	*info = -7;
    }
    if (*info != 0) {
	i__1 = -(*info);
	xerbla_("SPOSV ", &i__1);
	return 0;
    }

/*     Compute the Cholesky factorization A = U'*U or A = L*L'. */

    spotrf_(uplo, n, &a[a_offset], lda, info);
    if (*info == 0) {

/*        Solve the system A*X = B, overwriting B with X. */

	spotrs_(uplo, n, nrhs, &a[a_offset], lda, &b[b_offset], ldb, info);

    }
    return 0;

/*     End of SPOSV */

}